

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACLoader.cpp
# Opt level: O3

aiNode * __thiscall
Assimp::AC3DImporter::ConvertObjectSection
          (AC3DImporter *this,Object *object,vector<aiMesh_*,_std::allocator<aiMesh_*>_> *meshes,
          vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *outMaterials,
          vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>
          *materials,aiNode *parent)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  iterator __position;
  pointer paVar8;
  pointer paVar9;
  float fVar10;
  aiMesh *paVar11;
  vector<aiMesh*,std::allocator<aiMesh*>> *pvVar12;
  AC3DImporter *pAVar13;
  int iVar14;
  ai_uint32 aVar15;
  aiNode *paVar16;
  Logger *pLVar17;
  aiMesh *paVar18;
  aiMaterial *paVar19;
  ulong *puVar20;
  aiVector3D *__s;
  aiVector3D *paVar21;
  uint *puVar22;
  pointer ppVar23;
  Subdivider *pSVar24;
  pointer pcVar25;
  ulong *puVar26;
  void *__s_00;
  undefined4 *puVar27;
  aiNode **ppaVar28;
  aiNode *paVar29;
  runtime_error *prVar30;
  uint uVar31;
  aiFace *paVar32;
  aiFace *paVar33;
  ulong uVar34;
  char *__format;
  pointer ppVar35;
  ulong uVar36;
  pointer pSVar37;
  long lVar38;
  aiVector3D *paVar39;
  uint uVar40;
  AC3DImporter *pAVar41;
  uint uVar42;
  pointer pSVar43;
  uint uVar44;
  long lVar45;
  pointer ppVar46;
  uint i;
  vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_> *pvVar47;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> cpy;
  aiMesh *mesh;
  MatTable needMat;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  long local_c0;
  Object *local_b8;
  aiMesh *local_b0;
  allocator_type local_a1;
  vector<aiMesh*,std::allocator<aiMesh*>> *local_a0;
  pointer local_98;
  aiNode *local_90;
  vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_> *local_88;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_80;
  long local_68;
  AC3DImporter *local_60;
  AC3DImporter *local_58;
  pointer local_50;
  pointer local_48;
  uint *local_40;
  pointer local_38;
  
  local_a0 = (vector<aiMesh*,std::allocator<aiMesh*>> *)meshes;
  local_60 = this;
  local_58 = (AC3DImporter *)outMaterials;
  paVar16 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(paVar16);
  paVar16->mParent = parent;
  local_b8 = object;
  local_90 = paVar16;
  local_88 = materials;
  if ((object->vertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (object->vertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    if (((object->surfaces).
         super__Vector_base<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>
         ._M_impl.super__Vector_impl_data._M_finish ==
         (object->surfaces).
         super__Vector_base<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>
         ._M_impl.super__Vector_impl_data._M_start) || (object->numRefs == 0)) {
      pLVar17 = DefaultLogger::get();
      Logger::info(pLVar17,
                   "AC3D: No surfaces defined in object definition, a point list is returned");
      pcVar25 = (pointer)operator_new(0x520);
      pcVar25[0] = '\0';
      pcVar25[1] = '\0';
      pcVar25[2] = '\0';
      pcVar25[3] = '\0';
      pcVar25[4] = '\0';
      pcVar25[5] = '\0';
      pcVar25[6] = '\0';
      pcVar25[7] = '\0';
      pcVar25[8] = '\0';
      pcVar25[9] = '\0';
      pcVar25[10] = '\0';
      pcVar25[0xb] = '\0';
      memset(pcVar25 + 0x10,0,0xcc);
      pcVar25[0xe0] = '\0';
      pcVar25[0xe1] = '\0';
      pcVar25[0xe2] = '\0';
      pcVar25[0xe3] = '\0';
      pcVar25[0xe4] = '\0';
      pcVar25[0xe5] = '\0';
      pcVar25[0xe6] = '\0';
      pcVar25[0xe7] = '\0';
      pcVar25[0xe8] = '\0';
      pcVar25[0xe9] = '\0';
      pcVar25[0xea] = '\0';
      pcVar25[0xeb] = '\0';
      pcVar25[0xec] = '\0';
      pcVar25[0xed] = '\0';
      pcVar25[0xee] = '\0';
      pcVar25[0xef] = '\0';
      pcVar25[0xf0] = '\0';
      memset(pcVar25 + 0xf1,0x1b,0x3ff);
      pcVar25[0x4f0] = '\0';
      pcVar25[0x4f1] = '\0';
      pcVar25[0x4f2] = '\0';
      pcVar25[0x4f3] = '\0';
      pcVar25[0x4f8] = '\0';
      pcVar25[0x4f9] = '\0';
      pcVar25[0x4fa] = '\0';
      pcVar25[0x4fb] = '\0';
      pcVar25[0x4fc] = '\0';
      pcVar25[0x4fd] = '\0';
      pcVar25[0x4fe] = '\0';
      pcVar25[0x4ff] = '\0';
      pcVar25[0x500] = '\0';
      pcVar25[0x501] = '\0';
      pcVar25[0x502] = '\0';
      pcVar25[0x503] = '\0';
      pcVar25[0x504] = '\0';
      pcVar25[0x505] = '\0';
      pcVar25[0x506] = '\0';
      pcVar25[0x507] = '\0';
      pcVar25[0x508] = '\0';
      pcVar25[0x509] = '\0';
      pcVar25[0x50a] = '\0';
      pcVar25[0x50b] = '\0';
      pcVar25[0x50c] = '\0';
      pcVar25[0x50d] = '\0';
      pcVar25[0x50e] = '\0';
      pcVar25[0x50f] = '\0';
      pcVar25[0x510] = '\0';
      pcVar25[0x511] = '\0';
      pcVar25[0x512] = '\0';
      pcVar25[0x513] = '\0';
      pcVar25[0x514] = '\0';
      pcVar25[0x515] = '\0';
      pcVar25[0x516] = '\0';
      pcVar25[0x517] = '\0';
      pcVar25[0x518] = '\0';
      pcVar25[0x519] = '\0';
      pcVar25[0x51a] = '\0';
      pcVar25[0x51b] = '\0';
      memset(pcVar25 + 0x30,0,0xa0);
      pvVar12 = local_a0;
      local_e0._M_dataplus._M_p = pcVar25;
      std::vector<aiMesh*,std::allocator<aiMesh*>>::emplace_back<aiMesh*>
                (local_a0,(aiMesh **)&local_e0);
      local_c0 = *(long *)(*(long *)(pvVar12 + 8) + -8);
      uVar36 = ((long)(object->vertices).
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(object->vertices).
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
      iVar14 = (int)uVar36;
      *(int *)(local_c0 + 4) = iVar14;
      *(int *)(local_c0 + 8) = iVar14;
      uVar34 = uVar36 & 0xffffffff;
      puVar20 = (ulong *)operator_new__(uVar34 * 0x10 + 8);
      lVar38 = local_c0;
      *puVar20 = uVar34;
      puVar20 = puVar20 + 1;
      if (uVar34 != 0) {
        puVar26 = puVar20;
        do {
          *(undefined4 *)puVar26 = 0;
          puVar26[1] = 0;
          puVar26 = puVar26 + 2;
        } while (puVar26 != puVar20 + uVar34 * 2);
      }
      *(ulong **)(local_c0 + 0xd0) = puVar20;
      uVar34 = (uVar36 & 0xffffffff) * 0xc;
      __s_00 = operator_new__(uVar34);
      if (iVar14 == 0) {
        *(void **)(lVar38 + 0x10) = __s_00;
      }
      else {
        lVar45 = 0;
        memset(__s_00,0,((uVar34 - 0xc) / 0xc) * 0xc + 0xc);
        *(void **)(lVar38 + 0x10) = __s_00;
        paVar8 = (local_b8->vertices).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar34 = 0;
        do {
          *(undefined4 *)((long)__s_00 + lVar45 + 8) = *(undefined4 *)((long)&paVar8->z + lVar45);
          *(undefined8 *)((long)__s_00 + lVar45) = *(undefined8 *)((long)&paVar8->x + lVar45);
          *(undefined4 *)puVar20 = 1;
          puVar27 = (undefined4 *)operator_new__(4);
          puVar20[1] = (ulong)puVar27;
          *puVar27 = (int)uVar34;
          uVar34 = uVar34 + 1;
          puVar20 = puVar20 + 2;
          lVar45 = lVar45 + 0xc;
        } while (uVar34 < (uVar36 & 0xffffffff));
      }
      *(undefined4 *)(local_c0 + 0xe8) = 0;
      paVar19 = (aiMaterial *)operator_new(0x10);
      aiMaterial::aiMaterial(paVar19);
      pAVar13 = local_58;
      pAVar41 = local_58;
      local_e0._M_dataplus._M_p = (pointer)paVar19;
      std::vector<aiMaterial*,std::allocator<aiMaterial*>>::emplace_back<aiMaterial*>
                ((vector<aiMaterial*,std::allocator<aiMaterial*>> *)local_58,
                 (aiMaterial **)&local_e0);
      object = local_b8;
      ConvertMaterial(pAVar41,local_b8,
                      (local_88->
                      super__Vector_base<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>
                      )._M_impl.super__Vector_impl_data._M_start,
                      *(aiMaterial **)
                       (*(long *)&(pAVar13->super_BaseImporter).importerUnits._M_t._M_impl + -8));
    }
    else {
      local_e0._M_dataplus._M_p = (pointer)0x0;
      std::
      vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ::vector(&local_80,
               ((long)(materials->
                      super__Vector_base<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(materials->
                      super__Vector_base<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3,
               (value_type *)&local_e0,(allocator_type *)&local_b0);
      pSVar43 = (object->surfaces).
                super__Vector_base<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_98 = (object->surfaces).
                 super__Vector_base<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (pSVar43 != local_98) {
        do {
          uVar44 = pSVar43->mat;
          if ((ulong)((long)local_80.
                            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_80.
                            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) <= (ulong)uVar44) {
            pLVar17 = DefaultLogger::get();
            uVar44 = 0;
            Logger::error(pLVar17,"AC3D: material index is out of range");
          }
          ppVar46 = (pSVar43->entries).
                    super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppVar35 = (pSVar43->entries).
                    super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if (ppVar46 == ppVar35) {
            pLVar17 = DefaultLogger::get();
            Logger::warn(pLVar17,"AC3D: surface her zero vertex references");
            ppVar46 = (pSVar43->entries).
                      super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ppVar35 = (pSVar43->entries).
                      super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          }
          for (; ppVar46 != ppVar35; ppVar46 = ppVar46 + 1) {
            uVar36 = ((long)(local_b8->vertices).
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(local_b8->vertices).
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
            if (uVar36 < ppVar46->first || uVar36 - ppVar46->first == 0) {
              pLVar17 = DefaultLogger::get();
              Logger::warn(pLVar17,"AC3D: Invalid vertex reference");
              ppVar46->first = 0;
            }
          }
          if (local_80.
              super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar44].first == 0) {
            local_90->mNumMeshes = local_90->mNumMeshes + 1;
          }
          uVar31 = pSVar43->flags & 0xf;
          if (uVar31 == 0) {
LAB_003f4bbf:
            local_80.
            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar44].first =
                 local_80.
                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar44].first + 1;
            iVar14 = (int)((ulong)((long)(pSVar43->entries).
                                         super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pSVar43->entries).
                                        super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                     -0x55555555;
LAB_003f4bd5:
            local_80.
            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar44].second =
                 local_80.
                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar44].second + iVar14;
          }
          else {
            if (uVar31 != 2) {
              if (uVar31 != 1) {
                pLVar17 = DefaultLogger::get();
                Logger::warn(pLVar17,"AC3D: The type flag of a surface is unknown");
                *(byte *)&pSVar43->flags = (byte)pSVar43->flags & 0xf0;
                goto LAB_003f4bbf;
              }
              local_80.
              super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar44].first =
                   local_80.
                   super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar44].first +
                   (int)((ulong)((long)(pSVar43->entries).
                                       super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(pSVar43->entries).
                                      super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555
              ;
              iVar14 = (int)((ulong)((long)(pSVar43->entries).
                                           super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(pSVar43->entries).
                                          super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                       0x55555556;
              goto LAB_003f4bd5;
            }
            local_80.
            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar44].first =
                 ((int)((ulong)((long)(pSVar43->entries).
                                      super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pSVar43->entries).
                                     super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555
                 + local_80.
                   super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar44].first) - 1;
            local_80.
            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar44].second =
                 ((int)((ulong)((long)(pSVar43->entries).
                                      super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pSVar43->entries).
                                     super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 2) * 0x55555556 +
                 local_80.
                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar44].second) - 2;
          }
          pSVar43 = pSVar43 + 1;
          object = local_b8;
        } while (pSVar43 != local_98);
      }
      paVar16 = local_90;
      local_40 = (uint *)operator_new__((ulong)local_90->mNumMeshes << 2);
      paVar16->mMeshes = local_40;
      local_68 = (long)*(pointer *)(local_a0 + 8) - *(long *)local_a0;
      local_38 = local_80.
                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (local_80.
          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_80.
          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        uVar44 = 0;
        ppVar23 = local_80.
                  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pvVar47 = local_88;
        do {
          if (ppVar23->first != 0) {
            *local_40 = (uint)((ulong)((long)*(pointer *)(local_a0 + 8) - *(long *)local_a0) >> 3);
            local_50 = ppVar23;
            paVar18 = (aiMesh *)operator_new(0x520);
            paVar18->mPrimitiveTypes = 0;
            paVar18->mNumVertices = 0;
            paVar18->mNumFaces = 0;
            memset(&paVar18->mVertices,0,0xcc);
            paVar18->mBones = (aiBone **)0x0;
            paVar18->mMaterialIndex = 0;
            (paVar18->mName).length = 0;
            (paVar18->mName).data[0] = '\0';
            memset((paVar18->mName).data + 1,0x1b,0x3ff);
            paVar18->mNumAnimMeshes = 0;
            paVar18->mAnimMeshes = (aiAnimMesh **)0x0;
            paVar18->mMethod = 0;
            (paVar18->mAABB).mMin.x = 0.0;
            (paVar18->mAABB).mMin.y = 0.0;
            (paVar18->mAABB).mMin.z = 0.0;
            (paVar18->mAABB).mMax.x = 0.0;
            (paVar18->mAABB).mMax.y = 0.0;
            (paVar18->mAABB).mMax.z = 0.0;
            memset(paVar18->mColors,0,0xa0);
            __position._M_current = *(aiMesh ***)(local_a0 + 8);
            local_b0 = paVar18;
            if (__position._M_current == *(aiMesh ***)(local_a0 + 0x10)) {
              std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                        (local_a0,__position,&local_b0);
            }
            else {
              *__position._M_current = paVar18;
              *(long *)(local_a0 + 8) = *(long *)(local_a0 + 8) + 8;
            }
            pAVar13 = local_58;
            local_b0->mMaterialIndex =
                 (uint)((ulong)(*(long *)&(local_58->super_BaseImporter).importerUnits._M_t._M_impl
                               - (long)(local_58->super_BaseImporter)._vptr_BaseImporter) >> 3);
            paVar19 = (aiMaterial *)operator_new(0x10);
            aiMaterial::aiMaterial(paVar19);
            pAVar41 = pAVar13;
            local_e0._M_dataplus._M_p = (pointer)paVar19;
            std::vector<aiMaterial*,std::allocator<aiMaterial*>>::emplace_back<aiMaterial*>
                      ((vector<aiMaterial*,std::allocator<aiMaterial*>> *)pAVar13,
                       (aiMaterial **)&local_e0);
            ConvertMaterial(pAVar41,object,
                            (pvVar47->
                            super__Vector_base<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar44,
                            *(aiMaterial **)
                             (*(long *)&(pAVar13->super_BaseImporter).importerUnits._M_t._M_impl +
                             -8));
            paVar18 = local_b0;
            uVar31 = local_50->first;
            uVar36 = (ulong)uVar31;
            local_b0->mNumFaces = uVar31;
            if (uVar36 == 0) {
              prVar30 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_e0,"AC3D: No faces","");
              std::runtime_error::runtime_error(prVar30,(string *)&local_e0);
              *(undefined ***)prVar30 = &PTR__runtime_error_0080bf48;
              __cxa_throw(prVar30,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
            if (0x1000000 < uVar31) {
              prVar30 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_e0,"AC3D: Too many faces, would run out of memory","");
              std::runtime_error::runtime_error(prVar30,(string *)&local_e0);
              *(undefined ***)prVar30 = &PTR__runtime_error_0080bf48;
              __cxa_throw(prVar30,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
            puVar20 = (ulong *)operator_new__(uVar36 * 0x10 + 8);
            paVar11 = local_b0;
            local_40 = local_40 + 1;
            *puVar20 = uVar36;
            paVar33 = (aiFace *)(puVar20 + 1);
            paVar32 = paVar33;
            do {
              paVar32->mNumIndices = 0;
              paVar32->mIndices = (uint *)0x0;
              paVar32 = paVar32 + 1;
            } while (paVar32 != (aiFace *)(puVar20 + uVar36 * 2 + 1));
            paVar18->mFaces = paVar33;
            paVar18->mNumVertices = local_50->second;
            uVar31 = local_b0->mNumVertices;
            if ((ulong)uVar31 == 0) {
              prVar30 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_e0,"AC3D: No vertices","");
              std::runtime_error::runtime_error(prVar30,(string *)&local_e0);
              *(undefined ***)prVar30 = &PTR__runtime_error_0080bf48;
              __cxa_throw(prVar30,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
            if (0x1555555 < uVar31) {
              prVar30 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_e0,"AC3D: Too many vertices, would run out of memory","");
              std::runtime_error::runtime_error(prVar30,(string *)&local_e0);
              *(undefined ***)prVar30 = &PTR__runtime_error_0080bf48;
              __cxa_throw(prVar30,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
            uVar36 = (ulong)uVar31 * 0xc;
            __s = (aiVector3D *)operator_new__(uVar36);
            uVar36 = uVar36 - 0xc;
            memset(__s,0,(uVar36 - (uint)((int)uVar36 + (int)((uVar36 & 0xffffffff) / 0xc) * -0xc))
                         + 0xc);
            paVar11->mVertices = __s;
            if ((object->texture)._M_string_length == 0) {
              paVar21 = (aiVector3D *)0x0;
            }
            else {
              uVar31 = paVar11->mNumVertices;
              uVar36 = (ulong)uVar31 * 0xc;
              paVar21 = (aiVector3D *)operator_new__(uVar36);
              if (uVar31 != 0) {
                memset(paVar21,0,((uVar36 - 0xc) / 0xc) * 0xc + 0xc);
              }
              paVar11->mTextureCoords[0] = paVar21;
              paVar11->mNumUVComponents[0] = 2;
            }
            pSVar43 = (object->surfaces).
                      super__Vector_base<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ppVar23 = local_50;
            pvVar47 = local_88;
            if (pSVar43 != local_98) {
              uVar31 = 0;
              pSVar37 = local_98;
              do {
                paVar32 = paVar33;
                if (uVar44 == pSVar43->mat) {
                  ppVar46 = (pSVar43->entries).
                            super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                  uVar42 = pSVar43->flags & 0xf;
                  local_48 = pSVar43;
                  if (uVar42 == 0) {
                    paVar32 = paVar33 + 1;
                    uVar36 = ((long)ppVar46 -
                              (long)(pSVar43->entries).
                                    super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 2) *
                             -0x5555555555555555;
                    uVar42 = (uint)uVar36;
                    paVar33->mNumIndices = uVar42;
                    if (uVar42 != 0) {
                      local_c0 = CONCAT44(local_c0._4_4_,uVar31);
                      puVar22 = (uint *)operator_new__((uVar36 & 0xffffffff) << 2);
                      paVar33->mIndices = puVar22;
                      pSVar43 = local_48;
                      uVar31 = (uint)local_c0;
                      if (paVar33->mNumIndices != 0) {
                        uVar36 = 0;
                        lVar38 = 0;
                        do {
                          lVar45 = lVar38;
                          ppVar46 = (local_48->entries).
                                    super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                          paVar33->mIndices[uVar36] = (uint)local_c0 + (int)uVar36;
                          if (local_b0->mNumVertices <=
                              (uint)((int)((ulong)((long)__s + (lVar45 - (long)local_b0->mVertices))
                                          >> 2) * -0x55555555)) {
                            prVar30 = (runtime_error *)__cxa_allocate_exception(0x10);
                            local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&local_e0,"AC3D: Invalid number of vertices","");
                            std::runtime_error::runtime_error(prVar30,(string *)&local_e0);
                            *(undefined ***)prVar30 = &PTR__runtime_error_0080bf48;
                            __cxa_throw(prVar30,&DeadlyImportError::typeinfo,
                                        std::runtime_error::~runtime_error);
                          }
                          uVar31 = *(uint *)((long)&ppVar46->first + lVar45);
                          paVar9 = (object->vertices).
                                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                          paVar8 = paVar9 + uVar31;
                          uVar4 = paVar8->x;
                          uVar6 = paVar8->y;
                          uVar5 = (object->translation).x;
                          uVar7 = (object->translation).y;
                          fVar1 = paVar9[uVar31].z;
                          fVar2 = (object->translation).z;
                          *(ulong *)((long)&__s->x + lVar45) =
                               CONCAT44((float)uVar7 + (float)uVar6,(float)uVar5 + (float)uVar4);
                          *(float *)((long)&__s->z + lVar45) = fVar1 + fVar2;
                          if (paVar21 == (aiVector3D *)0x0) {
                            paVar21 = (aiVector3D *)0x0;
                          }
                          else {
                            paVar21->x = *(float *)((long)&(ppVar46->second).x + lVar45);
                            paVar21->y = *(float *)((long)&(ppVar46->second).y + lVar45);
                            paVar21 = paVar21 + 1;
                          }
                          uVar36 = uVar36 + 1;
                          lVar38 = lVar45 + 0xc;
                        } while (uVar36 < paVar33->mNumIndices);
                        __s = (aiVector3D *)((long)&__s[1].x + lVar45);
                        uVar31 = (uint)local_c0 + (int)uVar36;
                      }
                    }
                  }
                  else {
                    ppVar35 = (pSVar43->entries).
                              super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    iVar14 = (int)((ulong)((long)ppVar46 - (long)ppVar35) >> 2) * -0x55555555 -
                             (uint)(uVar42 == 2);
                    if (iVar14 != 0) {
                      do {
                        uVar40 = uVar31;
                        paVar39 = __s;
                        paVar32 = paVar33;
                        local_c0 = CONCAT44(local_c0._4_4_,iVar14);
                        paVar32->mNumIndices = 2;
                        puVar22 = (uint *)operator_new__(8);
                        paVar32->mIndices = puVar22;
                        *puVar22 = uVar40;
                        paVar32->mIndices[1] = uVar40 + 1;
                        if (ppVar35 ==
                            (local_48->entries).
                            super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish) {
                          prVar30 = (runtime_error *)__cxa_allocate_exception(0x10);
                          local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_e0,"AC3D: Bad line","");
                          std::runtime_error::runtime_error(prVar30,(string *)&local_e0);
                          *(undefined ***)prVar30 = &PTR__runtime_error_0080bf48;
                          __cxa_throw(prVar30,&DeadlyImportError::typeinfo,
                                      std::runtime_error::~runtime_error);
                        }
                        uVar36 = (ulong)ppVar35->first;
                        paVar8 = (local_b8->vertices).
                                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                        uVar34 = ((long)(local_b8->vertices).
                                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)paVar8 >>
                                 2) * -0x5555555555555555;
                        if (uVar34 < uVar36 || uVar34 - uVar36 == 0) {
                          __assert_fail("(*it2).first < object.vertices.size()",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/AC/ACLoader.cpp"
                                        ,0x2a3,
                                        "aiNode *Assimp::AC3DImporter::ConvertObjectSection(Object &, std::vector<aiMesh *> &, std::vector<aiMaterial *> &, const std::vector<Material> &, aiNode *)"
                                       );
                        }
                        paVar39->z = paVar8[uVar36].z;
                        fVar1 = paVar8[uVar36].y;
                        paVar39->x = paVar8[uVar36].x;
                        paVar39->y = fVar1;
                        if (paVar21 == (aiVector3D *)0x0) {
                          paVar21 = (aiVector3D *)0x0;
                        }
                        else {
                          paVar21->x = (ppVar35->second).x;
                          paVar21->y = (ppVar35->second).y;
                          paVar21 = paVar21 + 1;
                        }
                        if ((uVar42 == 1) && ((uint)local_c0 == 1)) {
                          ppVar35 = (local_48->entries).
                                    super__Vector_base<std::pair<unsigned_int,_aiVector2t<float>_>,_std::allocator<std::pair<unsigned_int,_aiVector2t<float>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                        }
                        else {
                          ppVar35 = ppVar35 + 1;
                        }
                        uVar31 = ppVar35->first;
                        paVar8 = (local_b8->vertices).
                                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                        paVar39[1].z = paVar8[uVar31].z;
                        paVar8 = paVar8 + uVar31;
                        fVar1 = paVar8->y;
                        paVar39[1].x = paVar8->x;
                        paVar39[1].y = fVar1;
                        if (paVar21 == (aiVector3D *)0x0) {
                          paVar21 = (aiVector3D *)0x0;
                        }
                        else {
                          paVar21->x = (ppVar35->second).x;
                          paVar21->y = (ppVar35->second).y;
                          paVar21 = paVar21 + 1;
                        }
                        iVar14 = (uint)local_c0 + -1;
                        paVar33 = paVar32 + 1;
                        __s = paVar39 + 2;
                        uVar31 = uVar40 + 2;
                      } while (iVar14 != 0);
                      uVar31 = uVar40 + 2;
                      __s = paVar39 + 2;
                      pSVar37 = local_98;
                      pSVar43 = local_48;
                      object = local_b8;
                      paVar32 = paVar32 + 1;
                    }
                  }
                }
                paVar33 = paVar32;
                pSVar43 = pSVar43 + 1;
                ppVar23 = local_50;
                pvVar47 = local_88;
              } while (pSVar43 != pSVar37);
            }
          }
          ppVar23 = ppVar23 + 1;
          uVar44 = uVar44 + 1;
        } while (ppVar23 != local_38);
      }
      pvVar12 = local_a0;
      if (object->subDiv != 0) {
        if (local_60->configEvalSubdivision == true) {
          pSVar24 = Subdivider::Create(CATMULL_CLARKE);
          pLVar17 = DefaultLogger::get();
          std::operator+(&local_e0,"AC3D: Evaluating subdivision surface: ",&object->name);
          Logger::info(pLVar17,local_e0._M_dataplus._M_p);
          lVar38 = local_68 >> 3;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
          }
          local_b0 = (aiMesh *)0x0;
          std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::vector
                    ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)&local_e0,
                     ((long)*(pointer *)(pvVar12 + 8) - *(long *)pvVar12 >> 3) - lVar38,&local_b0,
                     &local_a1);
          (*pSVar24->_vptr_Subdivider[3])
                    (pSVar24,*(long *)pvVar12 + local_68,
                     (long)(local_e0._M_string_length - (long)local_e0._M_dataplus._M_p) >> 3,
                     local_e0._M_dataplus._M_p,(ulong)object->subDiv,1);
          if (local_e0._M_string_length - (long)local_e0._M_dataplus._M_p != 0) {
            memmove((void *)(local_68 + *(long *)pvVar12),local_e0._M_dataplus._M_p,
                    local_e0._M_string_length - (long)local_e0._M_dataplus._M_p);
          }
          if ((aiMaterial *)local_e0._M_dataplus._M_p != (aiMaterial *)0x0) {
            operator_delete(local_e0._M_dataplus._M_p,
                            local_e0.field_2._M_allocated_capacity - (long)local_e0._M_dataplus._M_p
                           );
          }
          (*pSVar24->_vptr_Subdivider[1])(pSVar24);
        }
        else {
          pLVar17 = DefaultLogger::get();
          std::operator+(&local_e0,
                         "AC3D: Letting the subdivision surface untouched due to my configuration: "
                         ,&object->name);
          Logger::info(pLVar17,local_e0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
          }
        }
      }
      if (local_80.
          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_80.
                        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_80.
                              super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_80.
                              super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  paVar16 = local_90;
  uVar36 = (object->name)._M_string_length;
  if (uVar36 == 0) {
    switch(object->type) {
    case World:
      local_60->worlds = local_60->worlds + 1;
      __format = "ACWorld_%i";
      break;
    case Poly:
      local_60->polys = local_60->polys + 1;
      __format = "ACPoly_%i";
      break;
    case Group:
      local_60->groups = local_60->groups + 1;
      __format = "ACGroup_%i";
      break;
    default:
      goto switchD_003f562a_caseD_3;
    case Light:
      local_60->lights = local_60->lights + 1;
      __format = "ACLight_%i";
    }
    aVar15 = snprintf((local_90->mName).data,0x400,__format);
    (paVar16->mName).length = aVar15;
  }
  else if (uVar36 < 0x400) {
    (local_90->mName).length = (ai_uint32)uVar36;
    memcpy((local_90->mName).data,(object->name)._M_dataplus._M_p,uVar36);
    (paVar16->mName).data[uVar36] = '\0';
  }
switchD_003f562a_caseD_3:
  pAVar41 = local_58;
  pAVar13 = local_60;
  pvVar12 = local_a0;
  fVar1 = (object->rotation).a3;
  fVar2 = (object->rotation).b3;
  fVar3 = (object->rotation).c3;
  fVar10 = (object->rotation).a2;
  (paVar16->mTransformation).a1 = (object->rotation).a1;
  (paVar16->mTransformation).a2 = fVar10;
  (paVar16->mTransformation).a3 = fVar1;
  (paVar16->mTransformation).a4 = 0.0;
  fVar1 = (object->rotation).b2;
  (paVar16->mTransformation).b1 = (object->rotation).b1;
  (paVar16->mTransformation).b2 = fVar1;
  (paVar16->mTransformation).b3 = fVar2;
  (paVar16->mTransformation).b4 = 0.0;
  fVar1 = (object->rotation).c2;
  (paVar16->mTransformation).c1 = (object->rotation).c1;
  (paVar16->mTransformation).c2 = fVar1;
  (paVar16->mTransformation).c3 = fVar3;
  (paVar16->mTransformation).c4 = 0.0;
  (paVar16->mTransformation).d1 = 0.0;
  (paVar16->mTransformation).d2 = 0.0;
  (paVar16->mTransformation).d3 = 0.0;
  (paVar16->mTransformation).d4 = 1.0;
  if ((object->type == Group) || (object->numRefs == 0)) {
    (paVar16->mTransformation).a4 = (object->translation).x;
    (paVar16->mTransformation).b4 = (object->translation).y;
    (paVar16->mTransformation).c4 = (object->translation).z;
  }
  lVar38 = (long)(object->children).
                 super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(object->children).
                 super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  if (lVar38 != 0) {
    uVar36 = (lVar38 >> 5) * 0x6db6db6db6db6db7;
    uVar44 = (uint)uVar36;
    paVar16->mNumChildren = uVar44;
    ppaVar28 = (aiNode **)operator_new__((uVar36 & 0xffffffff) << 3);
    paVar16->mChildren = ppaVar28;
    if (uVar44 != 0) {
      lVar38 = 0;
      uVar36 = 0;
      do {
        paVar29 = ConvertObjectSection
                            (pAVar13,(Object *)
                                     ((long)&((local_b8->children).
                                              super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->type +
                                     lVar38),(vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)pvVar12,
                             (vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)pAVar41,local_88
                             ,paVar16);
        paVar16->mChildren[uVar36] = paVar29;
        uVar36 = uVar36 + 1;
        lVar38 = lVar38 + 0xe0;
      } while (uVar36 < paVar16->mNumChildren);
    }
  }
  return paVar16;
}

Assistant:

aiNode* AC3DImporter::ConvertObjectSection(Object& object,
    std::vector<aiMesh*>& meshes,
    std::vector<aiMaterial*>& outMaterials,
    const std::vector<Material>& materials,
    aiNode* parent)
{
    aiNode* node = new aiNode();
    node->mParent = parent;
    if (object.vertices.size())
    {
        if (!object.surfaces.size() || !object.numRefs)
        {
            /* " An object with 7 vertices (no surfaces, no materials defined).
                 This is a good way of getting point data into AC3D.
                 The Vertex->create convex-surface/object can be used on these
                 vertices to 'wrap' a 3d shape around them "
                 (http://www.opencity.info/html/ac3dfileformat.html)

                 therefore: if no surfaces are defined return point data only
             */

            ASSIMP_LOG_INFO("AC3D: No surfaces defined in object definition, "
                "a point list is returned");

            meshes.push_back(new aiMesh());
            aiMesh* mesh = meshes.back();

            mesh->mNumFaces = mesh->mNumVertices = (unsigned int)object.vertices.size();
            aiFace* faces = mesh->mFaces = new aiFace[mesh->mNumFaces];
            aiVector3D* verts = mesh->mVertices = new aiVector3D[mesh->mNumVertices];

            for (unsigned int i = 0; i < mesh->mNumVertices;++i,++faces,++verts)
            {
                *verts = object.vertices[i];
                faces->mNumIndices = 1;
                faces->mIndices = new unsigned int[1];
                faces->mIndices[0] = i;
            }

            // use the primary material in this case. this should be the
            // default material if all objects of the file contain points
            // and no faces.
            mesh->mMaterialIndex = 0;
            outMaterials.push_back(new aiMaterial());
            ConvertMaterial(object, materials[0], *outMaterials.back());
        }
        else
        {
            // need to generate one or more meshes for this object.
            // find out how many different materials we have
            typedef std::pair< unsigned int, unsigned int > IntPair;
            typedef std::vector< IntPair > MatTable;
            MatTable needMat(materials.size(),IntPair(0,0));

            std::vector<Surface>::iterator it,end = object.surfaces.end();
            std::vector<Surface::SurfaceEntry>::iterator it2,end2;

            for (it = object.surfaces.begin(); it != end; ++it)
            {
                unsigned int idx = (*it).mat;
                if (idx >= needMat.size())
                {
                    ASSIMP_LOG_ERROR("AC3D: material index is out of range");
                    idx = 0;
                }
                if ((*it).entries.empty())
                {
                    ASSIMP_LOG_WARN("AC3D: surface her zero vertex references");
                }

                // validate all vertex indices to make sure we won't crash here
                for (it2  = (*it).entries.begin(),
                     end2 = (*it).entries.end(); it2 != end2; ++it2)
                {
                    if ((*it2).first >= object.vertices.size())
                    {
                        ASSIMP_LOG_WARN("AC3D: Invalid vertex reference");
                        (*it2).first = 0;
                    }
                }

                if (!needMat[idx].first)++node->mNumMeshes;

                switch ((*it).flags & 0xf)
                {
                    // closed line
                case 0x1:

                    needMat[idx].first  += (unsigned int)(*it).entries.size();
                    needMat[idx].second += (unsigned int)(*it).entries.size()<<1u;
                    break;

                    // unclosed line
                case 0x2:

                    needMat[idx].first  += (unsigned int)(*it).entries.size()-1;
                    needMat[idx].second += ((unsigned int)(*it).entries.size()-1)<<1u;
                    break;

                    // 0 == polygon, else unknown
                default:

                    if ((*it).flags & 0xf)
                    {
                        ASSIMP_LOG_WARN("AC3D: The type flag of a surface is unknown");
                        (*it).flags &= ~(0xf);
                    }

                    // the number of faces increments by one, the number
                    // of vertices by surface.numref.
                    needMat[idx].first++;
                    needMat[idx].second += (unsigned int)(*it).entries.size();
                };
            }
            unsigned int* pip = node->mMeshes = new unsigned int[node->mNumMeshes];
            unsigned int mat = 0;
            const size_t oldm = meshes.size();
            for (MatTable::const_iterator cit = needMat.begin(), cend = needMat.end();
                cit != cend; ++cit, ++mat)
            {
                if (!(*cit).first)continue;

                // allocate a new aiMesh object
                *pip++ = (unsigned int)meshes.size();
                aiMesh* mesh = new aiMesh();
                meshes.push_back(mesh);

                mesh->mMaterialIndex = (unsigned int)outMaterials.size();
                outMaterials.push_back(new aiMaterial());
                ConvertMaterial(object, materials[mat], *outMaterials.back());

                // allocate storage for vertices and normals
                mesh->mNumFaces = (*cit).first;
                if (mesh->mNumFaces == 0) {
                    throw DeadlyImportError("AC3D: No faces");
                } else if (mesh->mNumFaces > AI_MAX_ALLOC(aiFace)) {
                    throw DeadlyImportError("AC3D: Too many faces, would run out of memory");
                }
                aiFace* faces = mesh->mFaces = new aiFace[mesh->mNumFaces];

                mesh->mNumVertices = (*cit).second;
                if (mesh->mNumVertices == 0) {
                    throw DeadlyImportError("AC3D: No vertices");
                } else if (mesh->mNumVertices > AI_MAX_ALLOC(aiVector3D)) {
                    throw DeadlyImportError("AC3D: Too many vertices, would run out of memory");
                }
                aiVector3D* vertices = mesh->mVertices = new aiVector3D[mesh->mNumVertices];
                unsigned int cur = 0;

                // allocate UV coordinates, but only if the texture name for the
                // surface is not empty
                aiVector3D* uv = NULL;
                if(object.texture.length())
                {
                    uv = mesh->mTextureCoords[0] = new aiVector3D[mesh->mNumVertices];
                    mesh->mNumUVComponents[0] = 2;
                }

                for (it = object.surfaces.begin(); it != end; ++it)
                {
                    if (mat == (*it).mat)
                    {
                        const Surface& src = *it;

                        // closed polygon
                        unsigned int type = (*it).flags & 0xf;
                        if (!type)
                        {
                            aiFace& face = *faces++;
                            if((face.mNumIndices = (unsigned int)src.entries.size()))
                            {
                                face.mIndices = new unsigned int[face.mNumIndices];
                                for (unsigned int i = 0; i < face.mNumIndices;++i,++vertices)
                                {
                                    const Surface::SurfaceEntry& entry = src.entries[i];
                                    face.mIndices[i] = cur++;

                                    // copy vertex positions
                                    if (static_cast<unsigned>(vertices - mesh->mVertices) >= mesh->mNumVertices) {
                                        throw DeadlyImportError("AC3D: Invalid number of vertices");
                                    }
                                    *vertices = object.vertices[entry.first] + object.translation;


                                    // copy texture coordinates
                                    if (uv)
                                    {
                                        uv->x =  entry.second.x;
                                        uv->y =  entry.second.y;
                                        ++uv;
                                    }
                                }
                            }
                        }
                        else
                        {

                            it2  = (*it).entries.begin();

                            // either a closed or an unclosed line
                            unsigned int tmp = (unsigned int)(*it).entries.size();
                            if (0x2 == type)--tmp;
                            for (unsigned int m = 0; m < tmp;++m)
                            {
                                aiFace& face = *faces++;

                                face.mNumIndices = 2;
                                face.mIndices = new unsigned int[2];
                                face.mIndices[0] = cur++;
                                face.mIndices[1] = cur++;

                                // copy vertex positions
                                if (it2 == (*it).entries.end() ) {
                                    throw DeadlyImportError("AC3D: Bad line");
                                }
                                ai_assert((*it2).first < object.vertices.size());
                                *vertices++ = object.vertices[(*it2).first];

                                // copy texture coordinates
                                if (uv)
                                {
                                    uv->x =  (*it2).second.x;
                                    uv->y =  (*it2).second.y;
                                    ++uv;
                                }


                                if (0x1 == type && tmp-1 == m)
                                {
                                    // if this is a closed line repeat its beginning now
                                    it2  = (*it).entries.begin();
                                }
                                else ++it2;

                                // second point
                                *vertices++ = object.vertices[(*it2).first];

                                if (uv)
                                {
                                    uv->x =  (*it2).second.x;
                                    uv->y =  (*it2).second.y;
                                    ++uv;
                                }
                            }
                        }
                    }
                }
            }

            // Now apply catmull clark subdivision if necessary. We split meshes into
            // materials which is not done by AC3D during smoothing, so we need to
            // collect all meshes using the same material group.
            if (object.subDiv)  {
                if (configEvalSubdivision) {
                    std::unique_ptr<Subdivider> div(Subdivider::Create(Subdivider::CATMULL_CLARKE));
                    ASSIMP_LOG_INFO("AC3D: Evaluating subdivision surface: "+object.name);

                    std::vector<aiMesh*> cpy(meshes.size()-oldm,NULL);
                    div->Subdivide(&meshes[oldm],cpy.size(),&cpy.front(),object.subDiv,true);
                    std::copy(cpy.begin(),cpy.end(),meshes.begin()+oldm);

                    // previous meshes are deleted vy Subdivide().
                }
                else {
                    ASSIMP_LOG_INFO("AC3D: Letting the subdivision surface untouched due to my configuration: "
                        +object.name);
                }
            }
        }
    }

    if (object.name.length())
        node->mName.Set(object.name);
    else
    {
        // generate a name depending on the type of the node
        switch (object.type)
        {
        case Object::Group:
            node->mName.length = ::ai_snprintf(node->mName.data, MAXLEN, "ACGroup_%i",groups++);
            break;
        case Object::Poly:
            node->mName.length = ::ai_snprintf(node->mName.data, MAXLEN, "ACPoly_%i",polys++);
            break;
        case Object::Light:
            node->mName.length = ::ai_snprintf(node->mName.data, MAXLEN, "ACLight_%i",lights++);
            break;

            // there shouldn't be more than one world, but we don't care
        case Object::World:
            node->mName.length = ::ai_snprintf(node->mName.data, MAXLEN, "ACWorld_%i",worlds++);
            break;
        }
    }


    // setup the local transformation matrix of the object
    // compute the transformation offset to the parent node
    node->mTransformation = aiMatrix4x4 ( object.rotation );

    if (object.type == Object::Group || !object.numRefs)
    {
        node->mTransformation.a4 = object.translation.x;
        node->mTransformation.b4 = object.translation.y;
        node->mTransformation.c4 = object.translation.z;
    }

    // add children to the object
    if (object.children.size())
    {
        node->mNumChildren = (unsigned int)object.children.size();
        node->mChildren = new aiNode*[node->mNumChildren];
        for (unsigned int i = 0; i < node->mNumChildren;++i)
        {
            node->mChildren[i] = ConvertObjectSection(object.children[i],meshes,outMaterials,materials,node);
        }
    }

    return node;
}